

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

call_matcher_base<bool_(int)> *
trompeloeil::find<bool(int)>(call_matcher_list<bool_(int)> *list,call_params_type_t<bool_(int)> *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  call_matcher_base<bool_(int)> *unaff_R12;
  call_matcher_base<bool_(int)> *pcVar4;
  call_matcher_base<bool_(int)> *pcVar5;
  call_matcher_base<bool_(int)> *pcVar6;
  bool bVar7;
  
  uVar3 = 0xffffffff;
  pcVar5 = (call_matcher_base<bool_(int)> *)0x0;
  pcVar6 = (call_matcher_base<bool_(int)> *)list;
  do {
    pcVar6 = (call_matcher_base<bool_(int)> *)
             (pcVar6->super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>).next;
    if (pcVar6 == (call_matcher_base<bool_(int)> *)list) {
      return pcVar5;
    }
    iVar1 = (*(pcVar6->super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>)._vptr_list_elem
              [3])(pcVar6,p);
    bVar7 = true;
    pcVar4 = unaff_R12;
    if ((char)iVar1 != '\0') {
      uVar2 = (*(pcVar6->super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>).
                _vptr_list_elem[4])(pcVar6);
      bVar7 = uVar2 != 0;
      pcVar4 = pcVar6;
      if ((bVar7) &&
         (pcVar4 = unaff_R12, uVar2 < uVar3 || pcVar5 == (call_matcher_base<bool_(int)> *)0x0)) {
        pcVar5 = pcVar6;
        uVar3 = uVar2;
      }
    }
    unaff_R12 = pcVar4;
  } while (bVar7);
  return pcVar4;
}

Assistant:

call_matcher_base <Sig> *
  find(
    call_matcher_list <Sig> &list,
    call_params_type_t <Sig> const &p)
  noexcept
  {
    call_matcher_base<Sig>* first_match = nullptr;
    unsigned lowest_cost = ~0U;
    for (auto& i : list)
    {
      if (i.matches(p))
      {
        unsigned cost = i.sequence_cost();
        if (cost == 0)
        {
          return &i;
        }
        if (!first_match || cost < lowest_cost)
        {
          first_match = &i;
          lowest_cost = cost;
        }
      }
    }
    return first_match;
  }